

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::emit_atomic_binop_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  Op op;
  Builder *this;
  ValueKind VVar1;
  Id IVar2;
  RawWidth width;
  Id type_id;
  Value *pVVar3;
  mapped_type *meta;
  Constant *this_00;
  APInt *this_01;
  uint64_t uVar4;
  Type *pTVar5;
  BufferAccessInfo BVar6;
  Operation *this_02;
  LoggingCallback p_Var7;
  void *pvVar8;
  ComponentType component_type_00;
  ulong uVar9;
  bool bVar10;
  uint32_t num_coords_full;
  uint32_t num_coords;
  Id image_id;
  ComponentType component_type;
  Id coords [3];
  uint32_t local_1058 [2];
  Id local_1050;
  Capability local_104c;
  Builder *local_1048;
  Capability local_103c;
  Id local_1038 [5];
  char acStack_1023 [4083];
  
  local_1048 = Converter::Impl::builder(impl);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_1050 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&local_1050);
  pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar3);
  VVar1 = LLVMBC::Value::get_value_kind((Value *)this_00);
  if (VVar1 != ConstantInt) {
    p_Var7 = get_thread_log_callback();
    if (p_Var7 != (LoggingCallback)0x0) {
      stack0xffffffffffffefd8 = 0x6163206e69;
      builtin_strncpy(acStack_1023,"st<T>.\n",8);
      local_1038._0_8_ = 0x2064696c61766e49;
      local_1038[2] = 0x65707974;
      local_1038[3] = 0x20444920;
      pvVar8 = get_thread_log_callback_userdata();
      (*p_Var7)(pvVar8,Error,(char *)local_1038);
      std::terminate();
    }
    emit_atomic_binop_instruction();
    std::terminate();
  }
  this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
  uVar4 = LLVMBC::APInt::getZExtValue(this_01);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  local_1038[2] = 0;
  local_1038[0] = 0;
  local_1038[1] = 0;
  local_1058[0] = 0;
  local_1058[1] = 0;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar2 = meta->index_offset_id;
    pTVar5 = LLVMBC::Value::getType((Value *)instruction);
    BVar6 = build_buffer_access(impl,instruction,1,IVar2,pTVar5,1);
    local_1038[0] = BVar6.index_id;
    local_1058[1] = 1;
    local_1058[0] = 1;
  }
  else {
    bVar10 = get_image_dimensions(impl,local_1050,local_1058,local_1058 + 1);
    if (!bVar10) {
      return false;
    }
    if (3 < local_1058[0]) {
      return false;
    }
    if (local_1058[0] != 0) {
      uVar9 = 0;
      do {
        pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar9 + 3);
        IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
        local_1038[uVar9] = IVar2;
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_1058[0]);
    }
  }
  IVar2 = spv::Builder::makeIntegerType(local_1048,0x20,false);
  IVar2 = Converter::Impl::build_vector(impl,IVar2,local_1038,local_1058[0]);
  storage = meta->storage;
  pTVar5 = LLVMBC::Value::getType((Value *)instruction);
  width = get_buffer_access_bits_per_component(impl,storage,pTVar5);
  if (width == B64) {
    local_104c = CapabilityInt64Atomics;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_1048->capabilities,&local_104c);
  }
  IVar2 = emit_atomic_access_chain(impl,meta,width,local_1050,IVar2,(ComponentType *)&local_104c);
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(local_1048,IVar2,DecorationNonUniform,-1);
  }
  bVar10 = (byte)uVar4 < 9;
  if (bVar10) {
    op = *(Op *)(&DAT_001c78c8 + (ulong)((uint)uVar4 & 0xf) * 4);
    local_103c = local_104c & 0xff;
    type_id = Converter::Impl::get_type_id(impl,(undefined1)local_104c,1,1,false);
    this_02 = Converter::Impl::allocate(impl,op,(Value *)instruction,type_id);
    Operation::add_id(this_02,IVar2);
    this = local_1048;
    IVar2 = spv::Builder::makeIntegerType(local_1048,0x20,false);
    IVar2 = spv::Builder::makeIntConstant(this,IVar2,1,false);
    Operation::add_id(this_02,IVar2);
    IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar2 = spv::Builder::makeIntConstant(this,IVar2,0,false);
    Operation::add_id(this_02,IVar2);
    pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
    component_type_00 = (ComponentType)local_103c;
    IVar2 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,IVar2);
    Operation::add_id(this_02,IVar2);
    Converter::Impl::add(impl,this_02,meta->rov);
    Converter::Impl::fixup_load_type_atomic(impl,component_type_00,1,(Value *)instruction);
  }
  return bVar10;
}

Assistant:

bool emit_atomic_binop_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];
	auto binop = static_cast<DXIL::AtomicBinOp>(
	    llvm::cast<llvm::ConstantInt>(instruction->getOperand(2))->getUniqueInteger().getZExtValue());

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer || meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 1, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	}
	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	spv::Op opcode;

	switch (binop)
	{
	case DXIL::AtomicBinOp::Exchange:
		opcode = spv::OpAtomicExchange;
		break;

	case DXIL::AtomicBinOp::IAdd:
		opcode = spv::OpAtomicIAdd;
		break;

	case DXIL::AtomicBinOp::And:
		opcode = spv::OpAtomicAnd;
		break;

	case DXIL::AtomicBinOp::Or:
		opcode = spv::OpAtomicOr;
		break;

	case DXIL::AtomicBinOp::Xor:
		opcode = spv::OpAtomicXor;
		break;

	case DXIL::AtomicBinOp::IMin:
		opcode = spv::OpAtomicSMin;
		break;

	case DXIL::AtomicBinOp::IMax:
		opcode = spv::OpAtomicSMax;
		break;

	case DXIL::AtomicBinOp::UMin:
		opcode = spv::OpAtomicUMin;
		break;

	case DXIL::AtomicBinOp::UMax:
		opcode = spv::OpAtomicUMax;
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction, impl.get_type_id(component_type, 1, 1));

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(impl.fixup_store_type_atomic(component_type, 1, impl.get_id_for_value(instruction->getOperand(6))));

	impl.add(op, meta.rov);

	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}